

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

char * CB::bufread_label(label *ld,char *c,io_buf *cache)

{
  ulong *puVar1;
  ulong uVar2;
  cb_class *new_ele;
  size_t sVar3;
  ostream *this;
  ulong *in_RSI;
  char **in_RDI;
  cb_class temp;
  size_t i;
  size_t total;
  size_t num;
  v_array<CB::cb_class> *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong *n;
  io_buf *in_stack_fffffffffffffff8;
  
  uVar2 = *in_RSI;
  v_array<CB::cb_class>::clear(in_stack_ffffffffffffffc0);
  n = in_RSI + 1;
  sVar3 = io_buf::buf_read(in_stack_fffffffffffffff8,in_RDI,(size_t)n);
  if (sVar3 < uVar2 << 4) {
    this = std::operator<<((ostream *)&std::cout,"error in demarshal of cost data");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
      new_ele = (cb_class *)*n;
      puVar1 = n + 1;
      n = n + 2;
      v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)*puVar1,new_ele);
    }
  }
  return (char *)n;
}

Assistant:

char* bufread_label(CB::label* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->costs.clear();
  c += sizeof(size_t);
  size_t total = sizeof(cb_class) * num;
  if (cache.buf_read(c, total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    cb_class temp = *(cb_class*)c;
    c += sizeof(cb_class);
    ld->costs.push_back(temp);
  }

  return c;
}